

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.cpp
# Opt level: O2

void __thiscall
duration_as_seconds_front_spaced_Test::duration_as_seconds_front_spaced_Test
          (duration_as_seconds_front_spaced_Test *this)

{
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Test_004aaad8;
  return;
}

Assistant:

TEST(duration, as_seconds_front_spaced) {
	EXPECT_EQ(duration_from_string(" 1234"sv).duration.count(), 1234);
	EXPECT_EQ(duration_from_string(" 0s"sv).duration.count(), 0);
	EXPECT_EQ(duration_from_string(" 1s"sv).duration.count(), 1);
	EXPECT_EQ(duration_from_string(" 5000ms"sv).duration.count(), 5);
	EXPECT_EQ(duration_from_string(" 5000000us"sv).duration.count(), 5);
	EXPECT_EQ(duration_from_string(" 5000000000ns"sv).duration.count(), 5);
	EXPECT_EQ(duration_from_string(" 1h"sv).duration.count(), 3600);
	EXPECT_EQ(duration_from_string(" 1hr"sv).duration.count(), 3600);
	EXPECT_EQ(duration_from_string(" 1hour"sv).duration.count(), 3600);
	EXPECT_EQ(duration_from_string(" 1hours"sv).duration.count(), 3600);
	EXPECT_EQ(duration_from_string(" 1hrs"sv).duration.count(), 3600);
	EXPECT_EQ(duration_from_string(" 1d"sv).duration.count(), 86400);
	EXPECT_EQ(duration_from_string(" 1day"sv).duration.count(), 86400);
	EXPECT_EQ(duration_from_string(" 1days"sv).duration.count(), 86400);
	EXPECT_EQ(duration_from_string(" 1w"sv).duration.count(), 604800);
	EXPECT_EQ(duration_from_string(" 1week"sv).duration.count(), 604800);
	EXPECT_EQ(duration_from_string(" 1weeks"sv).duration.count(), 604800);
	EXPECT_EQ(duration_from_string(" 1mo"sv).duration.count(), 2629746);
	EXPECT_EQ(duration_from_string(" 1mon"sv).duration.count(), 2629746);
	EXPECT_EQ(duration_from_string(" 1month"sv).duration.count(), 2629746);
	EXPECT_EQ(duration_from_string(" 1months"sv).duration.count(), 2629746);
	EXPECT_EQ(duration_from_string(" 1y"sv).duration.count(), 31556952);
	EXPECT_EQ(duration_from_string(" 1year"sv).duration.count(), 31556952);
	EXPECT_EQ(duration_from_string(" 1years"sv).duration.count(), 31556952);
}